

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O1

deMemPool * createPoolInternal(deMemPool *parent)

{
  deMemPool *pdVar1;
  undefined8 *puVar2;
  deMemPool *pdVar3;
  deMemPoolUtil *pdVar4;
  
  puVar2 = (undefined8 *)deMalloc(0x90);
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined4 *)puVar2 = 0x80;
  }
  if (puVar2 == (undefined8 *)0x0) {
    pdVar3 = (deMemPool *)0x0;
  }
  else {
    pdVar3 = (deMemPool *)(puVar2 + 2);
    *(int *)((long)puVar2 + 4) = *(int *)((long)puVar2 + 4) + 0x40;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0;
    puVar2[6] = 0;
    puVar2[7] = 0;
    puVar2[9] = puVar2;
    puVar2[3] = parent;
    if (parent == (deMemPool *)0x0) {
      pdVar4 = (deMemPoolUtil *)0x0;
    }
    else {
      parent->numChildren = parent->numChildren + 1;
      pdVar1 = parent->firstChild;
      if (pdVar1 != (deMemPool *)0x0) {
        pdVar1->prevPool = pdVar3;
      }
      puVar2[8] = pdVar1;
      parent->firstChild = pdVar3;
      pdVar4 = parent->util;
    }
    puVar2[4] = pdVar4;
  }
  return pdVar3;
}

Assistant:

static deMemPool* createPoolInternal (deMemPool* parent)
{
	deMemPool*	pool;
	MemPage*	initialPage;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (parent && parent->allowFailing)
	{
		if ((deRandom_getUint32(&parent->failRandom) & 16383) <= 15)
			return DE_NULL;
	}
#endif

	/* Init first page. */
	initialPage = MemPage_create(INITIAL_PAGE_SIZE);
	if (!initialPage)
		return DE_NULL;

	/* Alloc pool from initial page. */
	DE_ASSERT((int)sizeof(deMemPool) <= initialPage->capacity);
	pool = (deMemPool*)(initialPage + 1);
	initialPage->bytesAllocated += (int)sizeof(deMemPool);

	memset(pool, 0, sizeof(deMemPool));
	pool->currentPage = initialPage;

	/* Register to parent. */
	pool->parent = parent;
	if (parent)
	{
		parent->numChildren++;
		if (parent->firstChild) parent->firstChild->prevPool = pool;
		pool->nextPool = parent->firstChild;
		parent->firstChild = pool;
	}

	/* Get utils from parent. */
	pool->util = parent ? parent->util : DE_NULL;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	pool->allowFailing = parent ? parent->allowFailing : DE_FALSE;
	deRandom_init(&pool->failRandom, parent ? deRandom_getUint32(&parent->failRandom) : 0x1234abcd);
#endif

#if defined(DE_SUPPORT_DEBUG_POOLS)
	pool->enableDebugAllocs		= parent ? parent->enableDebugAllocs : DE_FALSE;
	pool->debugAllocListHead	= DE_NULL;

	/* Pool allocation index. */
	{
		deMemPool* root = pool;
		while (root->parent)
			root = root->parent;

		if (pool == root)
			root->lastAllocatedIndex = 0;

		pool->allocIndex = ++root->lastAllocatedIndex;

		/* \note Put the index of leaking pool here and add a breakpoint to catch leaks easily. */
/*		if (pool->allocIndex == 51)
			root = root;*/
	}
#endif

	return pool;
}